

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O3

bool tinyobj::exportGroupsToShape
               (shape_t *shape,PrimGroup *prim_group,
               vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_> *tags,int material_id,
               string *name,bool triangulate,vector<float,_std::allocator<float>_> *v)

{
  long lVar1;
  pointer *ppiVar2;
  pointer *ppuVar3;
  pointer pfVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar9;
  undefined8 uVar8;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  pointer pfVar13;
  undefined4 uVar17;
  iterator iVar14;
  iterator iVar15;
  iterator iVar16;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined8 uVar23;
  int iVar24;
  uint uVar25;
  bool bVar26;
  pointer pfVar27;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  pointer p_Var31;
  pointer pvVar32;
  pointer pvVar33;
  pointer p_Var34;
  long lVar35;
  ulong uVar36;
  ulong uVar37;
  size_t i;
  long lVar38;
  ulong uVar39;
  ulong uVar40;
  iterator iVar41;
  PrimGroup *pPVar42;
  ulong uVar43;
  pointer p_Var44;
  undefined7 in_register_00000089;
  index_t *piVar45;
  size_t k;
  ulong uVar46;
  long lVar47;
  float fVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [64];
  undefined1 auVar60 [16];
  vertex_index_t ind [3];
  real_t vx [3];
  real_t vy [3];
  face_t remainingFace;
  uchar local_11d;
  int local_11c;
  PrimGroup *local_118;
  pointer local_110;
  vector<tinyobj::index_t,std::allocator<tinyobj::index_t>> *local_108;
  index_t local_fc;
  index_t local_f0;
  index_t local_e4;
  index_t local_d8;
  int iStack_cc;
  ulong uStack_c8;
  int iStack_c0;
  undefined4 uStack_bc;
  undefined4 uStack_b8;
  vector<int,_std::allocator<int>_> *local_a8;
  uint local_9c;
  ulong local_98;
  float local_8c [3];
  vector<unsigned_int,std::allocator<unsigned_int>> *local_80;
  vector<int,std::allocator<int>> *local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_70;
  float local_64 [3];
  undefined8 local_58;
  vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_> local_50;
  vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_> *local_38;
  
  uVar30 = CONCAT71(in_register_00000089,triangulate) & 0xffffffff;
  if ((((prim_group->faceGroup).
        super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (prim_group->faceGroup).
        super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>._M_impl.
        super__Vector_impl_data._M_finish) &&
      ((prim_group->lineGroup).
       super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>._M_impl.
       super__Vector_impl_data._M_start ==
       (prim_group->lineGroup).
       super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>._M_impl.
       super__Vector_impl_data._M_finish)) &&
     ((prim_group->pointsGroup).
      super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (prim_group->pointsGroup).
      super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    bVar26 = false;
  }
  else {
    local_11c = material_id;
    local_118 = prim_group;
    std::__cxx11::string::_M_assign((string *)shape);
    pfVar27 = (local_118->faceGroup).
              super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (pfVar27 !=
        (local_118->faceGroup).super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_70 = &(shape->mesh).num_face_vertices;
      local_108 = (vector<tinyobj::index_t,std::allocator<tinyobj::index_t>> *)&shape->mesh;
      local_78 = (vector<int,std::allocator<int>> *)&(shape->mesh).material_ids;
      uVar40 = 0;
      local_9c = (uint)CONCAT71(in_register_00000089,triangulate);
      local_80 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                 &(shape->mesh).smoothing_group_ids;
      pPVar42 = local_118;
      local_38 = tags;
      do {
        pvVar33 = pfVar27[uVar40].vertex_indices.
                  super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar38 = (long)pfVar27[uVar40].vertex_indices.
                       super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar33 >> 2;
        uVar39 = lVar38 * -0x5555555555555555;
        if (2 < uVar39) {
          pfVar4 = pfVar27 + uVar40;
          local_110 = pfVar4;
          local_98 = uVar40;
          if ((char)uVar30 == '\0') {
            lVar38 = 4;
            uVar43 = uVar39;
            do {
              pvVar33 = pfVar27[uVar40].vertex_indices.
                        super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_d8.vertex_index = *(int *)((long)pvVar33 + lVar38 + -4);
              auVar55._8_8_ = 0;
              auVar55._0_8_ = *(ulong *)((long)&pvVar33->v_idx + lVar38);
              auVar55 = vshufps_avx(auVar55,auVar55,0xe1);
              uVar8 = vmovlps_avx(auVar55);
              local_d8.normal_index = (int)uVar8;
              local_d8.texcoord_index = (int)((ulong)uVar8 >> 0x20);
              iVar41._M_current =
                   (shape->mesh).indices.
                   super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar41._M_current ==
                  (shape->mesh).indices.
                  super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
                _M_realloc_insert<tinyobj::index_t_const&>(local_108,iVar41,&local_d8);
                pPVar42 = local_118;
              }
              else {
                (iVar41._M_current)->texcoord_index = local_d8.texcoord_index;
                (iVar41._M_current)->vertex_index = local_d8.vertex_index;
                (iVar41._M_current)->normal_index = local_d8.normal_index;
                ppiVar2 = &(shape->mesh).indices.
                           super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                           _M_impl.super__Vector_impl_data._M_finish;
                *ppiVar2 = *ppiVar2 + 1;
              }
              lVar38 = lVar38 + 0xc;
              uVar43 = uVar43 - 1;
            } while (uVar43 != 0);
            local_d8.vertex_index = CONCAT31(local_d8.vertex_index._1_3_,(uchar)uVar39);
            iVar14._M_current =
                 (shape->mesh).num_face_vertices.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar14._M_current ==
                (shape->mesh).num_face_vertices.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
              _M_realloc_insert<unsigned_char>(local_70,iVar14,(uchar *)&local_d8);
              pPVar42 = local_118;
            }
            else {
              *iVar14._M_current = (uchar)uVar39;
              ppuVar3 = &(shape->mesh).num_face_vertices.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppuVar3 = *ppuVar3 + 1;
            }
            uVar40 = local_98;
            iVar15._M_current =
                 (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar15._M_current ==
                (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (local_78,iVar15,&local_11c);
              pPVar42 = local_118;
            }
            else {
              *iVar15._M_current = local_11c;
              (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar15._M_current + 1;
            }
            iVar16._M_current =
                 (shape->mesh).smoothing_group_ids.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar16._M_current ==
                (shape->mesh).smoothing_group_ids.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>(local_80,iVar16,&local_110->smoothing_group_id)
              ;
              pPVar42 = local_118;
            }
            else {
              *iVar16._M_current = local_110->smoothing_group_id;
              (shape->mesh).smoothing_group_ids.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar16._M_current + 1;
            }
          }
          else {
            lVar38 = lVar38 * 0x5555555555555555;
            pfVar13 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            uVar43 = (long)(v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                           super__Vector_impl_data._M_finish - (long)pfVar13 >> 2;
            uVar30 = 1;
            pvVar32 = pvVar33;
            do {
              lVar47 = (long)pvVar32->v_idx;
              if (lVar47 * 3 + 2U < uVar43) {
                uVar28 = lVar38 + uVar30;
                if (lVar38 + uVar30 != 0) {
                  uVar28 = uVar30;
                }
                lVar29 = (long)pvVar33[uVar28].v_idx;
                if ((lVar29 * 3 + 2U < uVar43) &&
                   (lVar35 = (long)pvVar33[(uVar30 + 1) % uVar39].v_idx, lVar35 * 3 + 2U < uVar43))
                {
                  fVar48 = pfVar13[lVar29 * 3 + 1] - pfVar13[lVar47 * 3 + 1];
                  fVar18 = pfVar13[lVar29 * 3] - pfVar13[lVar47 * 3];
                  fVar19 = pfVar13[lVar29 * 3 + 2] - pfVar13[lVar47 * 3 + 2];
                  fVar20 = pfVar13[lVar35 * 3] - pfVar13[lVar29 * 3];
                  fVar21 = pfVar13[lVar35 * 3 + 1] - pfVar13[lVar29 * 3 + 1];
                  fVar22 = pfVar13[lVar35 * 3 + 2] - pfVar13[lVar29 * 3 + 2];
                  auVar60._8_4_ = 0x7fffffff;
                  auVar60._0_8_ = 0x7fffffff7fffffff;
                  auVar60._12_4_ = 0x7fffffff;
                  auVar55 = vfmsub231ss_fma(ZEXT416((uint)(fVar20 * fVar48)),ZEXT416((uint)fVar18),
                                            ZEXT416((uint)fVar21));
                  auVar49 = vfmsub231ss_fma(ZEXT416((uint)(fVar19 * fVar21)),ZEXT416((uint)fVar48),
                                            ZEXT416((uint)fVar22));
                  auVar50 = vfmsub231ss_fma(ZEXT416((uint)(fVar22 * fVar18)),ZEXT416((uint)fVar20),
                                            ZEXT416((uint)fVar19));
                  auVar55 = vandps_avx(auVar55,auVar60);
                  auVar49 = vandps_avx(auVar49,auVar60);
                  auVar50 = vandps_avx(auVar50,auVar60);
                  fVar48 = auVar49._0_4_;
                  if ((1.1920929e-07 < auVar55._0_4_) ||
                     ((1.1920929e-07 < fVar48 || (1.1920929e-07 < auVar50._0_4_)))) {
                    if ((fVar48 <= auVar55._0_4_) || (fVar48 <= auVar50._0_4_)) {
                      uVar8 = vcmpps_avx512vl(auVar49,auVar55,1);
                      lVar47 = 0;
                      uVar23 = vcmpps_avx512vl(auVar50,auVar55,1);
                      lVar29 = 2 - (ulong)((uint)uVar8 & (uint)uVar23 & 1);
                      goto LAB_0094a87b;
                    }
                    break;
                  }
                }
              }
              lVar47 = lVar38 + 1 + uVar30;
              pvVar32 = pvVar32 + 1;
              uVar30 = uVar30 + 1;
            } while (lVar47 != 1);
            lVar29 = 2;
            lVar47 = 1;
LAB_0094a87b:
            auVar59 = ZEXT1664(ZEXT816(0) << 0x40);
            uVar30 = 1;
            local_a8 = (vector<int,_std::allocator<int>_> *)((ulong)local_a8 & 0xffffffff00000000);
            pvVar32 = pvVar33;
            do {
              uVar28 = 0;
              if (uVar30 != uVar39) {
                uVar28 = uVar30;
              }
              lVar35 = (long)pvVar32->v_idx * 3;
              uVar37 = lVar35 + lVar47;
              if ((uVar37 < uVar43) && (uVar36 = lVar35 + lVar29, uVar36 < uVar43)) {
                lVar35 = (long)pvVar33[uVar28].v_idx * 3;
                uVar28 = lVar35 + lVar47;
                if ((uVar28 < uVar43) && (uVar46 = lVar35 + lVar29, uVar46 < uVar43)) {
                  auVar55 = vfmsub231ss_fma(ZEXT416((uint)(pfVar13[uVar28] * pfVar13[uVar36])),
                                            ZEXT416((uint)pfVar13[uVar37]),
                                            ZEXT416((uint)pfVar13[uVar46]));
                  auVar55 = vfmadd231ss_fma(ZEXT416((uint)local_a8._0_4_),auVar55,
                                            ZEXT416(0x3f000000));
                  auVar59 = ZEXT1664(auVar55);
                  local_a8 = (vector<int,_std::allocator<int>_> *)
                             CONCAT44(local_a8._4_4_,auVar55._0_4_);
                }
              }
              lVar35 = lVar38 + 1 + uVar30;
              uVar30 = uVar30 + 1;
              pvVar32 = pvVar32 + 1;
            } while (lVar35 != 1);
            local_58._0_4_ = pfVar4->smoothing_group_id;
            local_58._4_4_ = pfVar4->pad_;
            auVar58 = ZEXT1632(auVar59._0_16_);
            std::vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::vector
                      (&local_50,&pfVar27[uVar40].vertex_indices);
            auVar58 = vpcmpeqd_avx2(auVar58,auVar58);
            uStack_b8 = 0xffffffff;
            local_d8.vertex_index = auVar58._0_4_;
            local_d8.normal_index = auVar58._4_4_;
            local_d8.texcoord_index = auVar58._8_4_;
            iStack_cc = auVar58._12_4_;
            uStack_c8 = auVar58._16_8_;
            iStack_c0 = auVar58._24_4_;
            uStack_bc = auVar58._28_4_;
            lVar38 = (long)local_50.
                           super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_50.
                           super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            uVar30 = (lVar38 >> 2) * -0x5555555555555555;
            pvVar33 = local_50.
                      super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((3 < uVar30) &&
               (lVar35 = (long)(pfVar4->vertex_indices).
                               super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pfVar4->vertex_indices).
                               super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                               ._M_impl.super__Vector_impl_data._M_start, lVar35 != 0)) {
              uVar43 = 0;
              uVar40 = (lVar35 >> 2) * -0x5555555555555555;
              pvVar32 = local_50.
                        super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              uVar39 = uVar30;
              do {
                uVar28 = uVar30;
                piVar45 = &local_d8;
                uVar30 = uVar28;
                if (uVar43 < uVar28) {
                  uVar30 = 0;
                }
                lVar38 = 0;
                uVar43 = uVar43 - uVar30;
                pfVar13 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                          super__Vector_impl_data._M_start;
                uVar30 = (long)(v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                               super__Vector_impl_data._M_finish - (long)pfVar13 >> 2;
                do {
                  uVar37 = (uVar43 + lVar38) % uVar28;
                  piVar45->texcoord_index = pvVar33[uVar37].vn_idx;
                  uVar12 = pvVar33[uVar37].v_idx;
                  uVar17 = pvVar33[uVar37].vt_idx;
                  piVar45->vertex_index = uVar12;
                  piVar45->normal_index = uVar17;
                  uVar37 = (long)(int)uVar12 * 3 + lVar47;
                  if ((uVar37 < uVar30) &&
                     (uVar36 = (long)(int)uVar12 * 3 + lVar29, uVar36 < uVar30)) {
                    local_8c[lVar38] = pfVar13[uVar37];
                    fVar48 = pfVar13[uVar36];
                  }
                  else {
                    local_8c[lVar38] = 0.0;
                    fVar48 = 0.0;
                  }
                  local_64[lVar38] = fVar48;
                  lVar38 = lVar38 + 1;
                  piVar45 = piVar45 + 1;
                } while (lVar38 != 3);
                uVar40 = uVar40 - 1;
                if (uVar39 != uVar28) {
                  uVar40 = uVar28;
                }
                auVar55 = vfmsub213ss_fma(ZEXT416((uint)(local_64[2] - local_64[1])),
                                          ZEXT416((uint)(local_8c[1] - local_8c[0])),
                                          ZEXT416((uint)((local_8c[2] - local_8c[1]) *
                                                        (local_64[1] - local_64[0]))));
                if (0.0 <= auVar55._0_4_ * local_a8._0_4_) {
                  if (3 < uVar28) {
                    uVar39 = 3;
                    do {
                      lVar38 = (long)pvVar33[(uVar39 + uVar43) % uVar28].v_idx * 3;
                      uVar37 = lVar38 + lVar47;
                      if ((uVar37 < uVar30) && (uVar36 = lVar38 + lVar29, uVar36 < uVar30)) {
                        fVar48 = pfVar13[uVar36];
                        bVar26 = false;
                        lVar38 = 2;
                        lVar35 = 0;
                        fVar18 = local_64[2];
                        do {
                          fVar19 = local_64[lVar35];
                          uVar8 = vcmpps_avx512vl(ZEXT416((uint)fVar48),ZEXT416((uint)fVar18),5);
                          uVar23 = vcmpps_avx512vl(ZEXT416((uint)fVar48),ZEXT416((uint)fVar19),1);
                          if (((((ushort)uVar23 ^ (ushort)uVar8) & 1) == 0) &&
                             (pfVar13[uVar37] <
                              local_8c[lVar35] +
                              ((fVar48 - fVar19) * (local_8c[lVar38] - local_8c[lVar35])) /
                              (fVar18 - fVar19))) {
                            bVar26 = !bVar26;
                          }
                          lVar1 = lVar35 + 1;
                          lVar38 = lVar35;
                          lVar35 = lVar1;
                          fVar18 = fVar19;
                        } while (lVar1 != 3);
                        if (bVar26) goto LAB_0094aab3;
                      }
                      uVar39 = uVar39 + 1;
                    } while (uVar39 != uVar28);
                  }
                  auVar49._4_4_ = local_d8.texcoord_index;
                  auVar49._0_4_ = local_d8.normal_index;
                  auVar49._8_8_ = 0;
                  local_e4.vertex_index = local_d8.vertex_index;
                  local_f0.vertex_index = iStack_cc;
                  auVar55 = vshufps_avx(auVar49,auVar49,0xe1);
                  uVar8 = vmovlps_avx(auVar55);
                  local_e4.normal_index = (int)uVar8;
                  local_e4.texcoord_index = (int)((ulong)uVar8 >> 0x20);
                  auVar50._8_8_ = 0;
                  auVar50._0_8_ = uStack_c8;
                  local_fc.vertex_index = iStack_c0;
                  auVar55 = vshufps_avx(auVar50,auVar50,0xe1);
                  uVar8 = vmovlps_avx(auVar55);
                  local_f0.normal_index = (int)uVar8;
                  local_f0.texcoord_index = (int)((ulong)uVar8 >> 0x20);
                  auVar51._4_4_ = uStack_b8;
                  auVar51._0_4_ = uStack_bc;
                  auVar51._8_8_ = 0;
                  auVar55 = vshufps_avx(auVar51,auVar51,0xe1);
                  uVar8 = vmovlps_avx(auVar55);
                  local_fc.normal_index = (int)uVar8;
                  local_fc.texcoord_index = (int)((ulong)uVar8 >> 0x20);
                  iVar41._M_current =
                       (shape->mesh).indices.
                       super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
                  if (iVar41._M_current ==
                      (shape->mesh).indices.
                      super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
                    _M_realloc_insert<tinyobj::index_t_const&>(local_108,iVar41,&local_e4);
                    iVar41._M_current =
                         (shape->mesh).indices.
                         super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
                  }
                  else {
                    (iVar41._M_current)->texcoord_index = local_e4.texcoord_index;
                    (iVar41._M_current)->vertex_index = local_d8.vertex_index;
                    (iVar41._M_current)->normal_index = local_e4.normal_index;
                    iVar41._M_current =
                         (shape->mesh).indices.
                         super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                         _M_impl.super__Vector_impl_data._M_finish + 1;
                    (shape->mesh).indices.
                    super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                    super__Vector_impl_data._M_finish = iVar41._M_current;
                  }
                  if (iVar41._M_current ==
                      (shape->mesh).indices.
                      super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
                    _M_realloc_insert<tinyobj::index_t_const&>(local_108,iVar41,&local_f0);
                    iVar41._M_current =
                         (shape->mesh).indices.
                         super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
                  }
                  else {
                    (iVar41._M_current)->texcoord_index = local_f0.texcoord_index;
                    (iVar41._M_current)->vertex_index = local_f0.vertex_index;
                    (iVar41._M_current)->normal_index = local_f0.normal_index;
                    iVar41._M_current =
                         (shape->mesh).indices.
                         super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                         _M_impl.super__Vector_impl_data._M_finish + 1;
                    (shape->mesh).indices.
                    super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                    super__Vector_impl_data._M_finish = iVar41._M_current;
                  }
                  if (iVar41._M_current ==
                      (shape->mesh).indices.
                      super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
                    _M_realloc_insert<tinyobj::index_t_const&>(local_108,iVar41,&local_fc);
                  }
                  else {
                    (iVar41._M_current)->texcoord_index = local_fc.texcoord_index;
                    (iVar41._M_current)->vertex_index = local_fc.vertex_index;
                    (iVar41._M_current)->normal_index = local_fc.normal_index;
                    ppiVar2 = &(shape->mesh).indices.
                               super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                    *ppiVar2 = *ppiVar2 + 1;
                  }
                  local_11d = '\x03';
                  iVar14._M_current =
                       (shape->mesh).num_face_vertices.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (iVar14._M_current ==
                      (shape->mesh).num_face_vertices.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                    _M_realloc_insert<unsigned_char>(local_70,iVar14,&local_11d);
                  }
                  else {
                    *iVar14._M_current = '\x03';
                    ppuVar3 = &(shape->mesh).num_face_vertices.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish;
                    *ppuVar3 = *ppuVar3 + 1;
                  }
                  iVar15._M_current =
                       (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
                  if (iVar15._M_current ==
                      (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                              (local_78,iVar15,&local_11c);
                  }
                  else {
                    *iVar15._M_current = local_11c;
                    (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl
                    .super__Vector_impl_data._M_finish = iVar15._M_current + 1;
                  }
                  iVar16._M_current =
                       (shape->mesh).smoothing_group_ids.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (iVar16._M_current ==
                      (shape->mesh).smoothing_group_ids.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<unsigned_int,std::allocator<unsigned_int>>::
                    _M_realloc_insert<unsigned_int_const&>
                              (local_80,iVar16,&local_110->smoothing_group_id);
                  }
                  else {
                    *iVar16._M_current = local_110->smoothing_group_id;
                    (shape->mesh).smoothing_group_ids.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
                  }
                  uVar30 = (uVar43 + 1) % uVar28;
                  while (uVar39 = uVar30 + 1, uVar39 < uVar28) {
                    local_50.
                    super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar30].vn_idx =
                         local_50.
                         super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar39].vn_idx;
                    iVar24 = local_50.
                             super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar39].vt_idx;
                    local_50.
                    super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar30].v_idx =
                         local_50.
                         super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar39].v_idx;
                    local_50.
                    super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar30].vt_idx = iVar24;
                    uVar30 = uVar39;
                  }
                  pvVar32 = local_50.
                            super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -1;
                  pvVar33 = local_50.
                            super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  local_50.
                  super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                  ._M_impl.super__Vector_impl_data._M_finish = pvVar32;
                }
                else {
LAB_0094aab3:
                  uVar43 = uVar43 + 1;
                }
                lVar38 = (long)pvVar32 - (long)pvVar33;
                uVar30 = (lVar38 >> 2) * -0x5555555555555555;
              } while ((3 < uVar30) && (uVar39 = uVar28, uVar40 != 0));
            }
            uVar40 = local_98;
            uVar25 = local_9c;
            if (lVar38 == 0x24) {
              uVar5 = pvVar33->vt_idx;
              uVar9 = pvVar33->vn_idx;
              auVar52._4_4_ = uVar9;
              auVar52._0_4_ = uVar5;
              auVar52._8_8_ = 0;
              local_e4.vertex_index = pvVar33->v_idx;
              local_f0.vertex_index = pvVar33[1].v_idx;
              local_fc.vertex_index = pvVar33[2].v_idx;
              auVar55 = vshufps_avx(auVar52,auVar52,0xe1);
              uVar8 = vmovlps_avx(auVar55);
              local_e4.normal_index = (int)uVar8;
              local_e4.texcoord_index = (int)((ulong)uVar8 >> 0x20);
              uVar6 = pvVar33[1].vt_idx;
              uVar10 = pvVar33[1].vn_idx;
              auVar53._4_4_ = uVar10;
              auVar53._0_4_ = uVar6;
              auVar53._8_8_ = 0;
              auVar55 = vshufps_avx(auVar53,auVar53,0xe1);
              uVar8 = vmovlps_avx(auVar55);
              local_f0.normal_index = (int)uVar8;
              local_f0.texcoord_index = (int)((ulong)uVar8 >> 0x20);
              uVar7 = pvVar33[2].vt_idx;
              uVar11 = pvVar33[2].vn_idx;
              auVar54._4_4_ = uVar11;
              auVar54._0_4_ = uVar7;
              auVar54._8_8_ = 0;
              auVar55 = vshufps_avx(auVar54,auVar54,0xe1);
              uVar8 = vmovlps_avx(auVar55);
              local_fc.normal_index = (int)uVar8;
              local_fc.texcoord_index = (int)((ulong)uVar8 >> 0x20);
              iVar41._M_current =
                   (shape->mesh).indices.
                   super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar41._M_current ==
                  (shape->mesh).indices.
                  super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
                _M_realloc_insert<tinyobj::index_t_const&>(local_108,iVar41,&local_e4);
                iVar41._M_current =
                     (shape->mesh).indices.
                     super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl
                     .super__Vector_impl_data._M_finish;
              }
              else {
                (iVar41._M_current)->texcoord_index = local_e4.texcoord_index;
                (iVar41._M_current)->vertex_index = local_e4.vertex_index;
                (iVar41._M_current)->normal_index = local_e4.normal_index;
                iVar41._M_current =
                     (shape->mesh).indices.
                     super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl
                     .super__Vector_impl_data._M_finish + 1;
                (shape->mesh).indices.
                super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar41._M_current;
              }
              if (iVar41._M_current ==
                  (shape->mesh).indices.
                  super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
                _M_realloc_insert<tinyobj::index_t_const&>(local_108,iVar41,&local_f0);
                iVar41._M_current =
                     (shape->mesh).indices.
                     super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl
                     .super__Vector_impl_data._M_finish;
              }
              else {
                (iVar41._M_current)->texcoord_index = local_f0.texcoord_index;
                (iVar41._M_current)->vertex_index = local_f0.vertex_index;
                (iVar41._M_current)->normal_index = local_f0.normal_index;
                iVar41._M_current =
                     (shape->mesh).indices.
                     super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl
                     .super__Vector_impl_data._M_finish + 1;
                (shape->mesh).indices.
                super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar41._M_current;
              }
              if (iVar41._M_current ==
                  (shape->mesh).indices.
                  super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
                _M_realloc_insert<tinyobj::index_t_const&>(local_108,iVar41,&local_fc);
              }
              else {
                (iVar41._M_current)->texcoord_index = local_fc.texcoord_index;
                (iVar41._M_current)->vertex_index = local_fc.vertex_index;
                (iVar41._M_current)->normal_index = local_fc.normal_index;
                ppiVar2 = &(shape->mesh).indices.
                           super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                           _M_impl.super__Vector_impl_data._M_finish;
                *ppiVar2 = *ppiVar2 + 1;
              }
              local_11d = '\x03';
              iVar14._M_current =
                   (shape->mesh).num_face_vertices.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar14._M_current ==
                  (shape->mesh).num_face_vertices.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                _M_realloc_insert<unsigned_char>(local_70,iVar14,&local_11d);
              }
              else {
                *iVar14._M_current = '\x03';
                ppuVar3 = &(shape->mesh).num_face_vertices.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish;
                *ppuVar3 = *ppuVar3 + 1;
              }
              iVar15._M_current =
                   (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar15._M_current ==
                  (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          (local_78,iVar15,&local_11c);
              }
              else {
                *iVar15._M_current = local_11c;
                (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar15._M_current + 1;
              }
              iVar16._M_current =
                   (shape->mesh).smoothing_group_ids.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar16._M_current ==
                  (shape->mesh).smoothing_group_ids.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>
                          (local_80,iVar16,&local_110->smoothing_group_id);
                pvVar33 = local_50.
                          super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              }
              else {
                *iVar16._M_current = local_110->smoothing_group_id;
                (shape->mesh).smoothing_group_ids.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar16._M_current + 1;
                pvVar33 = local_50.
                          super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              }
            }
            uVar30 = (ulong)uVar25;
            pPVar42 = local_118;
            if (pvVar33 != (pointer)0x0) {
              operator_delete(pvVar33,(long)local_50.
                                            super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)pvVar33);
              pPVar42 = local_118;
            }
          }
        }
        pfVar27 = (pPVar42->faceGroup).
                  super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar40 = uVar40 + 1;
      } while (uVar40 < (ulong)((long)(pPVar42->faceGroup).
                                      super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pfVar27 >>
                               5));
      std::vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>::operator=
                (&(shape->mesh).tags,local_38);
    }
    p_Var31 = (local_118->lineGroup).
              super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>._M_impl.
              super__Vector_impl_data._M_start;
    pPVar42 = local_118;
    if (p_Var31 !=
        (local_118->lineGroup).
        super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_a8 = &(shape->lines).num_line_vertices;
      uVar30 = 0;
      do {
        pvVar33 = p_Var31[uVar30].vertex_indices.
                  super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (p_Var31[uVar30].vertex_indices.
            super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>.
            _M_impl.super__Vector_impl_data._M_finish == pvVar33) {
          uVar40 = 0;
        }
        else {
          lVar38 = 4;
          uVar39 = 0;
          do {
            local_d8.vertex_index = *(int *)((long)pvVar33 + lVar38 + -4);
            auVar56._8_8_ = 0;
            auVar56._0_8_ = *(ulong *)((long)&pvVar33->v_idx + lVar38);
            auVar55 = vshufps_avx(auVar56,auVar56,0xe1);
            uVar8 = vmovlps_avx(auVar55);
            local_d8.normal_index = (int)uVar8;
            local_d8.texcoord_index = (int)((ulong)uVar8 >> 0x20);
            iVar41._M_current =
                 (shape->lines).indices.
                 super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar41._M_current ==
                (shape->lines).indices.
                super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
              _M_realloc_insert<tinyobj::index_t_const&>
                        ((vector<tinyobj::index_t,std::allocator<tinyobj::index_t>> *)&shape->lines,
                         iVar41,&local_d8);
              pPVar42 = local_118;
            }
            else {
              (iVar41._M_current)->texcoord_index = local_d8.texcoord_index;
              (iVar41._M_current)->vertex_index = local_d8.vertex_index;
              (iVar41._M_current)->normal_index = local_d8.normal_index;
              ppiVar2 = &(shape->lines).indices.
                         super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
              *ppiVar2 = *ppiVar2 + 1;
            }
            p_Var31 = (pPVar42->lineGroup).
                      super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            uVar39 = uVar39 + 1;
            lVar38 = lVar38 + 0xc;
            pvVar33 = *(pointer *)
                       &p_Var31[uVar30].vertex_indices.
                        super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                        ._M_impl;
            uVar40 = ((long)*(pointer *)
                             ((long)&p_Var31[uVar30].vertex_indices.
                                     super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                                     ._M_impl + 8) - (long)pvVar33 >> 2) * -0x5555555555555555;
          } while (uVar39 < uVar40);
        }
        local_d8.vertex_index = (int)uVar40;
        iVar15._M_current =
             (shape->lines).num_line_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar15._M_current ==
            (shape->lines).num_line_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (local_a8,iVar15,&local_d8.vertex_index);
          pPVar42 = local_118;
        }
        else {
          *iVar15._M_current = local_d8.vertex_index;
          (shape->lines).num_line_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar15._M_current + 1;
        }
        p_Var31 = (pPVar42->lineGroup).
                  super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar30 = uVar30 + 1;
      } while (uVar30 < (ulong)(((long)(pPVar42->lineGroup).
                                       super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)p_Var31 >>
                                3) * -0x5555555555555555));
    }
    p_Var44 = (pPVar42->pointsGroup).
              super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>._M_impl.
              super__Vector_impl_data._M_start;
    p_Var34 = (pPVar42->pointsGroup).
              super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>._M_impl.
              super__Vector_impl_data._M_finish;
    bVar26 = true;
    if (p_Var44 != p_Var34) {
      uVar30 = 0;
      do {
        pvVar33 = p_Var44[uVar30].vertex_indices.
                  super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (p_Var44[uVar30].vertex_indices.
            super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>.
            _M_impl.super__Vector_impl_data._M_finish != pvVar33) {
          lVar38 = 4;
          uVar40 = 0;
          do {
            local_d8.vertex_index = *(int *)((long)pvVar33 + lVar38 + -4);
            auVar57._8_8_ = 0;
            auVar57._0_8_ = *(ulong *)((long)&pvVar33->v_idx + lVar38);
            auVar55 = vshufps_avx(auVar57,auVar57,0xe1);
            uVar8 = vmovlps_avx(auVar55);
            local_d8.normal_index = (int)uVar8;
            local_d8.texcoord_index = (int)((ulong)uVar8 >> 0x20);
            iVar41._M_current =
                 (shape->points).indices.
                 super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar41._M_current ==
                (shape->points).indices.
                super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
              _M_realloc_insert<tinyobj::index_t_const&>
                        ((vector<tinyobj::index_t,std::allocator<tinyobj::index_t>> *)&shape->points
                         ,iVar41,&local_d8);
              pPVar42 = local_118;
            }
            else {
              (iVar41._M_current)->texcoord_index = local_d8.texcoord_index;
              (iVar41._M_current)->vertex_index = local_d8.vertex_index;
              (iVar41._M_current)->normal_index = local_d8.normal_index;
              ppiVar2 = &(shape->points).indices.
                         super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
              *ppiVar2 = *ppiVar2 + 1;
            }
            p_Var44 = (pPVar42->pointsGroup).
                      super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            uVar40 = uVar40 + 1;
            lVar38 = lVar38 + 0xc;
            pvVar33 = p_Var44[uVar30].vertex_indices.
                      super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          } while (uVar40 < (ulong)(((long)p_Var44[uVar30].vertex_indices.
                                           super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pvVar33 >> 2) * -0x5555555555555555));
          p_Var34 = (pPVar42->pointsGroup).
                    super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        }
        uVar30 = uVar30 + 1;
      } while (uVar30 < (ulong)(((long)p_Var34 - (long)p_Var44 >> 3) * -0x5555555555555555));
      bVar26 = true;
    }
  }
  return bVar26;
}

Assistant:

static bool exportGroupsToShape(shape_t *shape, const PrimGroup &prim_group,
                                const std::vector<tag_t> &tags,
                                const int material_id, const std::string &name,
                                bool triangulate,
                                const std::vector<real_t> &v) {
  if (prim_group.IsEmpty()) {
    return false;
  }

  shape->name = name;

  // polygon
  if (!prim_group.faceGroup.empty()) {
    // Flatten vertices and indices
    for (size_t i = 0; i < prim_group.faceGroup.size(); i++) {
      const face_t &face = prim_group.faceGroup[i];

      size_t npolys = face.vertex_indices.size();

      if (npolys < 3) {
        // Face must have 3+ vertices.
        continue;
      }

      vertex_index_t i0 = face.vertex_indices[0];
      vertex_index_t i1(-1);
      vertex_index_t i2 = face.vertex_indices[1];

      if (triangulate) {
        // find the two axes to work in
        size_t axes[2] = {1, 2};
        for (size_t k = 0; k < npolys; ++k) {
          i0 = face.vertex_indices[(k + 0) % npolys];
          i1 = face.vertex_indices[(k + 1) % npolys];
          i2 = face.vertex_indices[(k + 2) % npolys];
          size_t vi0 = size_t(i0.v_idx);
          size_t vi1 = size_t(i1.v_idx);
          size_t vi2 = size_t(i2.v_idx);

          if (((3 * vi0 + 2) >= v.size()) || ((3 * vi1 + 2) >= v.size()) ||
              ((3 * vi2 + 2) >= v.size())) {
            // Invalid triangle.
            // FIXME(syoyo): Is it ok to simply skip this invalid triangle?
            continue;
          }
          real_t v0x = v[vi0 * 3 + 0];
          real_t v0y = v[vi0 * 3 + 1];
          real_t v0z = v[vi0 * 3 + 2];
          real_t v1x = v[vi1 * 3 + 0];
          real_t v1y = v[vi1 * 3 + 1];
          real_t v1z = v[vi1 * 3 + 2];
          real_t v2x = v[vi2 * 3 + 0];
          real_t v2y = v[vi2 * 3 + 1];
          real_t v2z = v[vi2 * 3 + 2];
          real_t e0x = v1x - v0x;
          real_t e0y = v1y - v0y;
          real_t e0z = v1z - v0z;
          real_t e1x = v2x - v1x;
          real_t e1y = v2y - v1y;
          real_t e1z = v2z - v1z;
          real_t cx = std::fabs(e0y * e1z - e0z * e1y);
          real_t cy = std::fabs(e0z * e1x - e0x * e1z);
          real_t cz = std::fabs(e0x * e1y - e0y * e1x);
          const real_t epsilon = std::numeric_limits<real_t>::epsilon();
          if (cx > epsilon || cy > epsilon || cz > epsilon) {
            // found a corner
            if (cx > cy && cx > cz) {
            } else {
              axes[0] = 0;
              if (cz > cx && cz > cy) axes[1] = 1;
            }
            break;
          }
        }

        real_t area = 0;
        for (size_t k = 0; k < npolys; ++k) {
          i0 = face.vertex_indices[(k + 0) % npolys];
          i1 = face.vertex_indices[(k + 1) % npolys];
          size_t vi0 = size_t(i0.v_idx);
          size_t vi1 = size_t(i1.v_idx);
          if (((vi0 * 3 + axes[0]) >= v.size()) ||
              ((vi0 * 3 + axes[1]) >= v.size()) ||
              ((vi1 * 3 + axes[0]) >= v.size()) ||
              ((vi1 * 3 + axes[1]) >= v.size())) {
            // Invalid index.
            continue;
          }
          real_t v0x = v[vi0 * 3 + axes[0]];
          real_t v0y = v[vi0 * 3 + axes[1]];
          real_t v1x = v[vi1 * 3 + axes[0]];
          real_t v1y = v[vi1 * 3 + axes[1]];
          area += (v0x * v1y - v0y * v1x) * static_cast<real_t>(0.5);
        }

        face_t remainingFace = face;  // copy
        size_t guess_vert = 0;
        vertex_index_t ind[3];
        real_t vx[3];
        real_t vy[3];

        // How many iterations can we do without decreasing the remaining
        // vertices.
        size_t remainingIterations = face.vertex_indices.size();
        size_t previousRemainingVertices = remainingFace.vertex_indices.size();

        while (remainingFace.vertex_indices.size() > 3 &&
               remainingIterations > 0) {
          npolys = remainingFace.vertex_indices.size();
          if (guess_vert >= npolys) {
            guess_vert -= npolys;
          }

          if (previousRemainingVertices != npolys) {
            // The number of remaining vertices decreased. Reset counters.
            previousRemainingVertices = npolys;
            remainingIterations = npolys;
          } else {
            // We didn't consume a vertex on previous iteration, reduce the
            // available iterations.
            remainingIterations--;
          }

          for (size_t k = 0; k < 3; k++) {
            ind[k] = remainingFace.vertex_indices[(guess_vert + k) % npolys];
            size_t vi = size_t(ind[k].v_idx);
            if (((vi * 3 + axes[0]) >= v.size()) ||
                ((vi * 3 + axes[1]) >= v.size())) {
              // ???
              vx[k] = static_cast<real_t>(0.0);
              vy[k] = static_cast<real_t>(0.0);
            } else {
              vx[k] = v[vi * 3 + axes[0]];
              vy[k] = v[vi * 3 + axes[1]];
            }
          }
          real_t e0x = vx[1] - vx[0];
          real_t e0y = vy[1] - vy[0];
          real_t e1x = vx[2] - vx[1];
          real_t e1y = vy[2] - vy[1];
          real_t cross = e0x * e1y - e0y * e1x;
          // if an internal angle
          if (cross * area < static_cast<real_t>(0.0)) {
            guess_vert += 1;
            continue;
          }

          // check all other verts in case they are inside this triangle
          bool overlap = false;
          for (size_t otherVert = 3; otherVert < npolys; ++otherVert) {
            size_t idx = (guess_vert + otherVert) % npolys;

            if (idx >= remainingFace.vertex_indices.size()) {
              // ???
              continue;
            }

            size_t ovi = size_t(remainingFace.vertex_indices[idx].v_idx);

            if (((ovi * 3 + axes[0]) >= v.size()) ||
                ((ovi * 3 + axes[1]) >= v.size())) {
              // ???
              continue;
            }
            real_t tx = v[ovi * 3 + axes[0]];
            real_t ty = v[ovi * 3 + axes[1]];
            if (pnpoly(3, vx, vy, tx, ty)) {
              overlap = true;
              break;
            }
          }

          if (overlap) {
            guess_vert += 1;
            continue;
          }

          // this triangle is an ear
          {
            index_t idx0, idx1, idx2;
            idx0.vertex_index = ind[0].v_idx;
            idx0.normal_index = ind[0].vn_idx;
            idx0.texcoord_index = ind[0].vt_idx;
            idx1.vertex_index = ind[1].v_idx;
            idx1.normal_index = ind[1].vn_idx;
            idx1.texcoord_index = ind[1].vt_idx;
            idx2.vertex_index = ind[2].v_idx;
            idx2.normal_index = ind[2].vn_idx;
            idx2.texcoord_index = ind[2].vt_idx;

            shape->mesh.indices.push_back(idx0);
            shape->mesh.indices.push_back(idx1);
            shape->mesh.indices.push_back(idx2);

            shape->mesh.num_face_vertices.push_back(3);
            shape->mesh.material_ids.push_back(material_id);
            shape->mesh.smoothing_group_ids.push_back(face.smoothing_group_id);
          }

          // remove v1 from the list
          size_t removed_vert_index = (guess_vert + 1) % npolys;
          while (removed_vert_index + 1 < npolys) {
            remainingFace.vertex_indices[removed_vert_index] =
                remainingFace.vertex_indices[removed_vert_index + 1];
            removed_vert_index += 1;
          }
          remainingFace.vertex_indices.pop_back();
        }

        if (remainingFace.vertex_indices.size() == 3) {
          i0 = remainingFace.vertex_indices[0];
          i1 = remainingFace.vertex_indices[1];
          i2 = remainingFace.vertex_indices[2];
          {
            index_t idx0, idx1, idx2;
            idx0.vertex_index = i0.v_idx;
            idx0.normal_index = i0.vn_idx;
            idx0.texcoord_index = i0.vt_idx;
            idx1.vertex_index = i1.v_idx;
            idx1.normal_index = i1.vn_idx;
            idx1.texcoord_index = i1.vt_idx;
            idx2.vertex_index = i2.v_idx;
            idx2.normal_index = i2.vn_idx;
            idx2.texcoord_index = i2.vt_idx;

            shape->mesh.indices.push_back(idx0);
            shape->mesh.indices.push_back(idx1);
            shape->mesh.indices.push_back(idx2);

            shape->mesh.num_face_vertices.push_back(3);
            shape->mesh.material_ids.push_back(material_id);
            shape->mesh.smoothing_group_ids.push_back(face.smoothing_group_id);
          }
        }
      } else {
        for (size_t k = 0; k < npolys; k++) {
          index_t idx;
          idx.vertex_index = face.vertex_indices[k].v_idx;
          idx.normal_index = face.vertex_indices[k].vn_idx;
          idx.texcoord_index = face.vertex_indices[k].vt_idx;
          shape->mesh.indices.push_back(idx);
        }

        shape->mesh.num_face_vertices.push_back(
            static_cast<unsigned char>(npolys));
        shape->mesh.material_ids.push_back(material_id);  // per face
        shape->mesh.smoothing_group_ids.push_back(
            face.smoothing_group_id);  // per face
      }
    }

    shape->mesh.tags = tags;
  }

  // line
  if (!prim_group.lineGroup.empty()) {
    // Flatten indices
    for (size_t i = 0; i < prim_group.lineGroup.size(); i++) {
      for (size_t j = 0; j < prim_group.lineGroup[i].vertex_indices.size();
           j++) {
        const vertex_index_t &vi = prim_group.lineGroup[i].vertex_indices[j];

        index_t idx;
        idx.vertex_index = vi.v_idx;
        idx.normal_index = vi.vn_idx;
        idx.texcoord_index = vi.vt_idx;

        shape->lines.indices.push_back(idx);
      }

      shape->lines.num_line_vertices.push_back(
          int(prim_group.lineGroup[i].vertex_indices.size()));
    }
  }

  // points
  if (!prim_group.pointsGroup.empty()) {
    // Flatten & convert indices
    for (size_t i = 0; i < prim_group.pointsGroup.size(); i++) {
      for (size_t j = 0; j < prim_group.pointsGroup[i].vertex_indices.size();
           j++) {
        const vertex_index_t &vi = prim_group.pointsGroup[i].vertex_indices[j];

        index_t idx;
        idx.vertex_index = vi.v_idx;
        idx.normal_index = vi.vn_idx;
        idx.texcoord_index = vi.vt_idx;

        shape->points.indices.push_back(idx);
      }
    }
  }

  return true;
}